

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ratectrl.c
# Opt level: O0

int clamp_iframe_target_size(AV1_COMP *cpi,int64_t target)

{
  long local_30;
  int64_t max_rate;
  RateControlCfg *rc_cfg;
  RATE_CONTROL *rc;
  int64_t target_local;
  AV1_COMP *cpi_local;
  
  target_local = target;
  if ((cpi->oxcf).rc_cfg.max_intra_bitrate_pct != 0) {
    local_30 = (long)((long)(cpi->rc).avg_frame_bandwidth *
                     (ulong)(cpi->oxcf).rc_cfg.max_intra_bitrate_pct) / 100;
    if (target < local_30) {
      local_30 = target;
    }
    target_local = local_30;
  }
  if ((cpi->rc).max_frame_bandwidth < target_local) {
    target_local = (int64_t)(cpi->rc).max_frame_bandwidth;
  }
  return (int)target_local;
}

Assistant:

static int clamp_iframe_target_size(const AV1_COMP *const cpi, int64_t target) {
  const RATE_CONTROL *rc = &cpi->rc;
  const RateControlCfg *const rc_cfg = &cpi->oxcf.rc_cfg;
  if (rc_cfg->max_intra_bitrate_pct) {
    const int64_t max_rate =
        (int64_t)rc->avg_frame_bandwidth * rc_cfg->max_intra_bitrate_pct / 100;
    target = AOMMIN(target, max_rate);
  }
  if (target > rc->max_frame_bandwidth) target = rc->max_frame_bandwidth;
  return (int)target;
}